

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O2

void __thiscall
density_tests::
QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
::ThreadData::handle_pending_consume(ThreadData *this,size_t i_pending_consume_index)

{
  long *plVar1;
  long lVar2;
  int32_t iVar3;
  long lVar4;
  reentrant_consume_operation *this_00;
  
  lVar4 = i_pending_consume_index * 0x20;
  lVar2 = *(long *)(*(long *)(this + 0x1408) + 0x18 + lVar4);
  this_00 = (reentrant_consume_operation *)(*(long *)(this + 0x1408) + lVar4);
  (**(code **)(*(long *)(*(long *)(this + 8) + 0x88) + lVar2 * 8))(this_00);
  iVar3 = EasyRandom::get_bool((EasyRandom *)(this + 0x50));
  if (iVar3 == 0) {
    density::
    lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
    ::reentrant_consume_operation::cancel(this_00);
  }
  else {
    density::
    lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
    ::reentrant_consume_operation::commit(this_00);
    plVar1 = (long *)(*(long *)(this + 0x20) + lVar2 * 0x10);
    *plVar1 = *plVar1 + -1;
    *(long *)(this + 0x13e8) = *(long *)(this + 0x13e8) + 1;
  }
  std::
  vector<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>::ThreadData::ReentrantConsume,_std::allocator<density_tests::QueueGenericTester<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>::ThreadData::ReentrantConsume>_>
  ::erase((vector<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::ThreadData::ReentrantConsume,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::ThreadData::ReentrantConsume>_>
           *)(this + 0x1408),(ReentrantConsume *)(lVar4 + *(long *)(this + 0x1408)));
  return;
}

Assistant:

void handle_pending_consume(size_t const i_pending_consume_index)
            {
                // commit or cancel a reentrant consume
                auto &     pending_consume = m_pending_reentrant_consumes[i_pending_consume_index];
                auto const type_index      = pending_consume.m_type_index;

                (*m_parent_tester.m_reentrant_consume_cases[type_index])(
                  pending_consume.m_operation);

                if (m_random.get_bool())
                {
                    pending_consume.m_operation.commit();
                    m_final_stats.m_counters[type_index].m_existing--;
                    m_consumes_committed++;
                }
                else
                {
                    pending_consume.m_operation.cancel();
                }

                m_pending_reentrant_consumes.erase(
                  m_pending_reentrant_consumes.begin() + i_pending_consume_index);
            }